

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPath.cpp
# Opt level: O0

string * __thiscall
CppUnit::TestPath::toString_abi_cxx11_(string *__return_storage_ptr__,TestPath *this)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  string local_50 [32];
  uint local_30;
  int index;
  allocator<char> local_1a;
  undefined1 local_19;
  TestPath *local_18;
  TestPath *this_local;
  string *asString;
  
  local_19 = 0;
  local_18 = this;
  this_local = (TestPath *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"/",&local_1a)
  ;
  std::allocator<char>::~allocator(&local_1a);
  for (local_30 = 0; uVar1 = local_30, iVar2 = (*this->_vptr_TestPath[10])(), (int)uVar1 < iVar2;
      local_30 = local_30 + 1) {
    if (0 < (int)local_30) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'/');
    }
    iVar2 = (*this->_vptr_TestPath[0xb])(this,(ulong)local_30);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x30))(local_50);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_50);
    std::__cxx11::string::~string(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string 
TestPath::toString() const
{
  std::string asString( "/" );
  for ( int index =0; index < getTestCount(); ++index )
  {
    if ( index > 0 )
      asString += '/';
    asString += getTestAt(index)->getName();
  }

  return asString;
}